

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O2

void __thiscall
optimization::remove_dead_code::Remove_Dead_Code::optimize_func
          (Remove_Dead_Code *this,string *funcId,MirFunction *func)

{
  bool bVar1;
  __shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar2;
  __shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Base_ptr p_Var4;
  _Self __tmp;
  byte bVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
  *this_01;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<optimization::livevar_analyse::Livevar_Analyse,mir::inst::MirFunction&>
            ((MirFunction *)local_50);
  this_01 = &this->func_livevar_analyse;
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
             ::operator[](this_01,funcId)->
             super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::__shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>::
  operator=(this_00,(__shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
                     *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
           ::operator[](this_01,funcId);
  livevar_analyse::Livevar_Analyse::build
            ((pmVar2->
             super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  while( true ) {
    bVar5 = 0;
    for (p_Var4 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
               ::operator[](this_01,funcId);
      p_Var3 = &std::
                map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                ::operator[](&((pmVar2->
                               super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->livevars,(key_type *)(p_Var4 + 1))->
                super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_50 + 0x10),p_Var3);
      bVar1 = remove_dead_code(this,(shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)
                                    (local_50 + 0x10),(BasicBlk *)&p_Var4[1]._M_parent,
                               &func->variables);
      bVar5 = bVar5 | bVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    }
    if (bVar5 == 0) break;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
             ::operator[](this_01,funcId);
    livevar_analyse::Livevar_Analyse::build
              ((pmVar2->
               super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func) {
    func_livevar_analyse[funcId] =
        std::make_shared<livevar_analyse::Livevar_Analyse>(func);
    func_livevar_analyse[funcId]->build();
    while (true) {  // delete death code for each block and build again util no
                    // death code to remove
      bool modify = false;
      for (auto iter = func.basic_blks.begin(); iter != func.basic_blks.end();
           iter++) {
        modify |= remove_dead_code(
            func_livevar_analyse[funcId]->livevars[iter->first], iter->second,
            func.variables);
      }
      if (!modify) {
        break;
      }
      func_livevar_analyse[funcId]->build();
    }
  }